

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

CBString * uniqueItemName(CBString *__return_storage_ptr__,UModelIndex *index)

{
  TreeModel *this;
  byte bVar1;
  UINT8 UVar2;
  UINT8 subtype;
  CBString subtypeString;
  CBString fileText;
  CBString itemName;
  CBString itemText;
  UModelIndex local_130;
  CBString local_118;
  CBString local_100;
  CBString local_e8;
  CBString local_d0;
  CBString local_b8;
  CBString local_a0;
  CBString local_88;
  CBString local_70;
  CBString local_58;
  CBString local_40;
  
  if (((index->r < 0) || (index->c < 0)) || (index->m == (TreeModel *)0x0)) {
    Bstrlib::CBString::CBString(__return_storage_ptr__,"InvalidIndex");
    return __return_storage_ptr__;
  }
  this = index->m;
  TreeModel::name(&local_b8,this,index);
  TreeModel::text(&local_88,this,index);
  Bstrlib::CBString::CBString(__return_storage_ptr__,&local_b8);
  bVar1 = TreeModel::type(this,index);
  if ((bVar1 - 0x4f < 6) || (bVar1 == 0x42)) {
    if (local_88.super_tagbstring.slen == 0) {
      Bstrlib::CBString::CBString((CBString *)&local_130,&local_b8);
    }
    else {
      Bstrlib::CBString::operator+(&local_100,&local_b8,'_');
      Bstrlib::CBString::operator+((CBString *)&local_130,&local_100,&local_88);
    }
    Bstrlib::CBString::operator=(__return_storage_ptr__,(CBString *)&local_130);
    Bstrlib::CBString::~CBString((CBString *)&local_130);
    if (local_88.super_tagbstring.slen == 0) goto LAB_0012e3a1;
  }
  else {
    if (bVar1 != 0x43) goto LAB_0012e3a1;
    TreeModel::findParentOfType(&local_130,this,index,'B');
    TreeModel::text(&local_100,this,&local_130);
    if (local_100.super_tagbstring.slen == 0) {
      TreeModel::name(&local_118,this,&local_130);
    }
    else {
      TreeModel::name(&local_58,this,&local_130);
      Bstrlib::CBString::operator+(&local_40,&local_58,'_');
      Bstrlib::CBString::operator+(&local_118,&local_40,&local_100);
    }
    Bstrlib::CBString::operator=(__return_storage_ptr__,&local_118);
    Bstrlib::CBString::~CBString(&local_118);
    if (local_100.super_tagbstring.slen != 0) {
      Bstrlib::CBString::~CBString(&local_40);
      Bstrlib::CBString::~CBString(&local_58);
    }
    UVar2 = TreeModel::subtype(this,index);
    if ((UVar2 == '\x02') || (UVar2 = TreeModel::subtype(this,index), UVar2 == '\x18')) {
      TreeModel::name(&local_e8,this,index);
      Bstrlib::CBString::operator+(&local_d0,&local_e8,'_');
      Bstrlib::CBString::operator+(&local_118,&local_d0,__return_storage_ptr__);
      Bstrlib::CBString::operator=(__return_storage_ptr__,&local_118);
      Bstrlib::CBString::~CBString(&local_118);
      Bstrlib::CBString::~CBString(&local_d0);
      Bstrlib::CBString::~CBString(&local_e8);
    }
  }
  Bstrlib::CBString::~CBString(&local_100);
LAB_0012e3a1:
  UVar2 = TreeModel::type(this,index);
  subtype = TreeModel::subtype(this,index);
  itemSubtypeToUString((CBString *)&local_130,UVar2,subtype);
  UVar2 = TreeModel::type(this,index);
  itemTypeToUString(&local_70,UVar2);
  if (local_130.i._4_4_ == 0) {
    Bstrlib::CBString::CBString(&local_a0);
  }
  else {
    Bstrlib::operator+(&local_a0,'_',(CBString *)&local_130);
  }
  Bstrlib::CBString::operator+(&local_e8,&local_70,&local_a0);
  Bstrlib::CBString::operator+(&local_d0,&local_e8,'_');
  Bstrlib::CBString::operator+(&local_118,&local_d0,__return_storage_ptr__);
  Bstrlib::CBString::operator=(__return_storage_ptr__,&local_118);
  Bstrlib::CBString::~CBString(&local_118);
  Bstrlib::CBString::~CBString(&local_d0);
  Bstrlib::CBString::~CBString(&local_e8);
  Bstrlib::CBString::~CBString(&local_a0);
  Bstrlib::CBString::~CBString(&local_70);
  fixFileName(__return_storage_ptr__,true);
  Bstrlib::CBString::~CBString((CBString *)&local_130);
  Bstrlib::CBString::~CBString(&local_88);
  Bstrlib::CBString::~CBString(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

UString uniqueItemName(const UModelIndex & index)
{
    // Sanity check
    if (!index.isValid())
        return UString("InvalidIndex");
    
    // Get model from index
    const TreeModel* model = (const TreeModel*)index.model();
    
    // Construct the name
    UString itemName = model->name(index);
    UString itemText = model->text(index);
    
    // Default name
    UString name = itemName;
    switch (model->type(index)) {
        case Types::NvarEntry:
        case Types::VssEntry:
        case Types::SysFEntry:
        case Types::EvsaEntry:
        case Types::PhoenixFlashMapEntry:
        case Types::InsydeFlashDeviceMapEntry:
        case Types::File:
            name = itemText.isEmpty() ? itemName : itemName + '_' + itemText;
            break;
        case Types::Section: {
            // Get parent file name
            UModelIndex fileIndex = model->findParentOfType(index, Types::File);
            UString fileText = model->text(fileIndex);
            name = fileText.isEmpty() ? model->name(fileIndex) : model->name(fileIndex) + '_' + fileText;
            
            // Special case of GUIDed sections
            if (model->subtype(index) == EFI_SECTION_GUID_DEFINED || model->subtype(index) == EFI_SECTION_FREEFORM_SUBTYPE_GUID) {
                name = model->name(index) +'_' + name;
            }
        } break;
    }
    
    // Populate subtypeString
    UString subtypeString = itemSubtypeToUString(model->type(index), model->subtype(index));
    
    // Create final name
    name = itemTypeToUString(model->type(index))
    + (subtypeString.length() ? ('_' + subtypeString) : UString())
    + '_' + name;
    
    fixFileName(name, true);
    
    return name;
}